

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  IResultCapture *pIVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  SectionEndInfo endInfo;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  char *local_48;
  size_t sStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  uint64_t uStack_20;
  double local_18;
  
  if (this->m_sectionIncluded == true) {
    local_68 = (size_type *)(this->m_info).name._M_dataplus._M_p;
    paVar5 = &(this->m_info).name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68 == paVar5) {
      local_58 = paVar5->_M_allocated_capacity;
      uStack_50 = *(undefined8 *)((long)&(this->m_info).name.field_2 + 8);
      local_68 = &local_58;
    }
    else {
      local_58 = paVar5->_M_allocated_capacity;
    }
    local_60 = (this->m_info).name._M_string_length;
    (this->m_info).name._M_dataplus._M_p = (pointer)paVar5;
    (this->m_info).name._M_string_length = 0;
    (this->m_info).name.field_2._M_local_buf[0] = '\0';
    local_48 = (this->m_info).lineInfo.file;
    sStack_40 = (this->m_info).lineInfo.line;
    local_38 = (this->m_assertions).passed;
    uStack_30 = (this->m_assertions).failed;
    local_28 = (this->m_assertions).failedButOk;
    uStack_20 = (this->m_assertions).skipped;
    lVar3 = std::chrono::_V2::system_clock::now();
    local_18 = (double)((lVar3 - (this->m_timer).m_nanoseconds) / 1000) / 1000000.0;
    iVar2 = std::uncaught_exceptions();
    if (iVar2 < 1) {
      pIVar4 = getResultCapture();
      lVar3 = 0x20;
    }
    else {
      pIVar4 = getResultCapture();
      lVar3 = 0x28;
    }
    (**(code **)((long)pIVar4->_vptr_IResultCapture + lVar3))(pIVar4,&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
  }
  pcVar1 = (this->m_info).name._M_dataplus._M_p;
  paVar5 = &(this->m_info).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo{ CATCH_MOVE(m_info), m_assertions, m_timer.getElapsedSeconds() };
            if ( uncaught_exceptions() ) {
                getResultCapture().sectionEndedEarly( CATCH_MOVE(endInfo) );
            } else {
                getResultCapture().sectionEnded( CATCH_MOVE( endInfo ) );
            }
        }
    }